

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_base.h
# Opt level: O2

int __thiscall
fructose::test_base<TestAmsRouter>::do_run(test_base<TestAmsRouter> *this,suite *suite)

{
  undefined8 uVar1;
  uint uVar2;
  long *plVar3;
  mapped_type *pmVar4;
  ostream *poVar5;
  runtime_error *this_00;
  pointer __k;
  code *pcVar6;
  string title;
  pair<void_(TestAmsRouter::*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_fructose::test_root::test_info>
  value;
  string local_50;
  
  plVar3 = (long *)__dynamic_cast(this,&typeinfo,&TestAmsRouter::typeinfo,0);
  if (plVar3 != (long *)0x0) {
    for (__k = (suite->
               super__Vector_base<fructose::test_root::test_info,_std::allocator<fructose::test_root::test_info>_>
               )._M_impl.super__Vector_impl_data._M_start;
        __k != (suite->
               super__Vector_base<fructose::test_root::test_info,_std::allocator<fructose::test_root::test_info>_>
               )._M_impl.super__Vector_impl_data._M_finish; __k = __k + 1) {
      pmVar4 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<void_(TestAmsRouter::*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_fructose::test_root::test_info>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<void_(TestAmsRouter::*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_fructose::test_root::test_info>_>_>_>
               ::operator[](&this->m_tests,&__k->m_test_name);
      std::
      pair<void_(TestAmsRouter::*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_fructose::test_root::test_info>
      ::pair(&value,pmVar4);
      uVar1 = value._8_8_;
      pcVar6 = (code *)value.first;
      if (value.first == 0) {
        poVar5 = std::operator<<((ostream *)&std::cerr,"No such test case: ");
        poVar5 = std::operator<<(poVar5,(string *)__k);
        std::endl<char,std::char_traits<char>>(poVar5);
      }
      else {
        std::operator+(&title,"Running test case ",&__k->m_test_name);
        if ((this->super_test_root).m_verbose == true) {
          poVar5 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
          poVar5 = std::operator<<(poVar5,(string *)&title);
          poVar5 = std::endl<char,std::char_traits<char>>(poVar5);
          test_root::underline(&local_50,&title,'=');
          poVar5 = std::operator<<(poVar5,(string *)&local_50);
          poVar5 = std::operator<<(poVar5,'\n');
          std::endl<char,std::char_traits<char>>(poVar5);
          std::__cxx11::string::~string((string *)&local_50);
        }
        (**(code **)(*plVar3 + 0x10))();
        plVar3[2] = (long)__k;
        if (((ulong)pcVar6 & 1) != 0) {
          pcVar6 = *(code **)(*(long *)(uVar1 + (long)plVar3) + -1 + (long)pcVar6);
        }
        (*pcVar6)((long *)(uVar1 + (long)plVar3),__k);
        (**(code **)(*plVar3 + 0x18))();
        std::__cxx11::string::~string((string *)&title);
      }
      test_root::test_info::~test_info(&value.second);
    }
    uVar2 = 1;
    if ((this->super_test_root).m_error_count == 0) {
      uVar2 = (uint)(this->super_test_root).m_exception_happened;
    }
    return uVar2;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error
            (this_00,
             "problem in test set-up; probable cause: test container class not passed to test_base template"
            );
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

inline int 
test_base<test_container>::do_run(const suite& suite) 
{
    test_container* runner = dynamic_cast<test_container*>(this);
    
    if (runner == 0)
    {
        throw std::runtime_error(
            "problem in test set-up; probable cause: "
            "test container class not passed to test_base template");
    }

    for (typename suite::const_iterator it = suite.begin(); it != suite.end(); ++it)
    {
        std::pair<test_case, test_info> value = m_tests[it->m_test_name];
        test_case test_case = value.first;
        if (test_case)
        {
            const std::string title = "Running test case " + it->m_test_name;
            if (verbose())
            {
                std::cout << std::endl << title << std::endl
                          << underline(title) << '\n' << std::endl;
            }
            runner->setup();
            runner->set_test_info(&(*it));
            try
            {
                (runner->*test_case)(it->m_test_name);    
                runner->teardown();
            }
            catch(std::exception& ex)
            {
                runner->teardown();
                set_exception_happened();
		std::cout << ex.what() << std::endl;
            }
        }
        else
        {
            std::cerr << "No such test case: " << it->m_test_name << std::endl;
        }
    }
    
    return return_status();
}